

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fp.c
# Opt level: O2

LispPTR N_OP_fquotient(LispPTR parg1,LispPTR parg2)

{
  ushort uVar1;
  uint uVar2;
  LispPTR LVar3;
  float *pfVar4;
  LispPTR *pLVar5;
  float fVar6;
  float fVar7;
  
  if ((parg1 & 0xfff0000) == 0xf0000) {
    fVar7 = (float)(int)(parg1 | 0xffff0000);
  }
  else if ((parg1 & 0xfff0000) == 0xe0000) {
    fVar7 = (float)(parg1 & 0xffff);
  }
  else {
    uVar1 = *(ushort *)((ulong)(parg1 >> 8 & 0xfffffe) + (long)MDStypetbl ^ 2) & 0x7ff;
    if (uVar1 == 2) {
      pLVar5 = NativeAligned4FromLAddr(parg1);
      fVar7 = (float)(int)*pLVar5;
    }
    else {
      if (uVar1 != 3) {
        MachineState.tosvalue = parg2;
        MachineState.errorexit = 1;
        return 0xffffffff;
      }
      pfVar4 = (float *)NativeAligned4FromLAddr(parg1);
      fVar7 = *pfVar4;
    }
  }
  if ((parg2 & 0xfff0000) == 0xf0000) {
    uVar2 = parg2 | 0xffff0000;
  }
  else {
    if ((parg2 & 0xfff0000) != 0xe0000) {
      uVar1 = *(ushort *)((ulong)(parg2 >> 8 & 0xfffffffe) + (long)MDStypetbl ^ 2) & 0x7ff;
      if (uVar1 == 2) {
        pLVar5 = NativeAligned4FromLAddr(parg2);
        fVar6 = (float)(int)*pLVar5;
      }
      else {
        if (uVar1 != 3) {
          MachineState.tosvalue = parg2;
          MachineState.errorexit = 1;
          return 0xffffffff;
        }
        pfVar4 = (float *)NativeAligned4FromLAddr(parg2);
        fVar6 = *pfVar4;
      }
      goto LAB_0011cf71;
    }
    uVar2 = parg2 & 0xffff;
  }
  fVar6 = (float)(int)uVar2;
LAB_0011cf71:
  if (0x7f7fffff < (uint)ABS(fVar7 / fVar6)) {
    MachineState.tosvalue = parg2;
    MachineState.errorexit = 1;
    return 0xffffffff;
  }
  pfVar4 = (float *)createcell68k(3);
  *pfVar4 = fVar7 / fVar6;
  LVar3 = LAddrFromNative(pfVar4);
  return LVar3;
}

Assistant:

LispPTR N_OP_fquotient(LispPTR parg1, LispPTR parg2) {
  float arg1, arg2;
  float result;
  float *wordp;

  N_MakeFloat(parg1, arg1, parg2);
  N_MakeFloat(parg2, arg2, parg2);
  FPCLEAR;
  result = arg1 / arg2;

  if (FPTEST(result)) ERROR_EXIT(parg2);
  wordp = (float *)createcell68k(TYPE_FLOATP);
  *wordp = result;
  return (LAddrFromNative(wordp));
}